

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadratictetra.cpp
# Opt level: O3

void pzgeom::TPZQuadraticTetra::GradX<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZFMatrix<double> *gradx)

{
  long lVar1;
  int j;
  long lVar2;
  int i;
  long lVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  TPZFNMatrix<30,_double> dphi;
  TPZFNMatrix<10,_double> phi;
  TPZFMatrix<double> local_2a0;
  double local_210 [31];
  TPZFMatrix<double> local_118;
  double local_88 [11];
  
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (gradx,3,3);
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (gradx);
  local_118.fElem = local_88;
  local_118.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 10;
  local_118.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_118.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_118.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_118.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018b55d8;
  local_118.fSize = 10;
  local_118.fGiven = local_118.fElem;
  TPZVec<int>::TPZVec(&local_118.fPivot.super_TPZVec<int>,0);
  local_118.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_118.fPivot.super_TPZVec<int>.fStore = local_118.fPivot.fExtAlloc;
  local_118.fPivot.super_TPZVec<int>.fNElements = 0;
  local_118.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_118.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_118.fWork.fStore = (double *)0x0;
  local_118.fWork.fNElements = 0;
  local_118.fWork.fNAlloc = 0;
  local_118.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018b52e8;
  local_2a0.fElem = local_210;
  local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 10;
  local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01814ad8;
  local_2a0.fSize = 0x1e;
  local_2a0.fGiven = local_2a0.fElem;
  TPZVec<int>::TPZVec(&local_2a0.fPivot.super_TPZVec<int>,0);
  local_2a0.fPivot.super_TPZVec<int>.fStore = local_2a0.fPivot.fExtAlloc;
  local_2a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_2a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_2a0.fWork.fStore = (double *)0x0;
  local_2a0.fWork.fNElements = 0;
  local_2a0.fWork.fNAlloc = 0;
  local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018147e8;
  TShape<double>(loc,&local_118,&local_2a0);
  lVar3 = 0;
  do {
    lVar2 = 0;
    do {
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,lVar2,lVar3);
      if ((local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
         (local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
         ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      gradx->fElem[lVar2] =
           extraout_XMM0_Qa *
           local_2a0.fElem[local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3] +
           gradx->fElem[lVar2];
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,lVar2,lVar3);
      if ((local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
         (local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar1 <= lVar2) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      gradx->fElem[lVar1 + lVar2] =
           extraout_XMM0_Qa_00 *
           local_2a0.fElem[local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3 + 1] +
           gradx->fElem[lVar1 + lVar2];
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,lVar2,lVar3);
      if ((local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
         (local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar1 <= lVar2) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      gradx->fElem[lVar1 * 2 + lVar2] =
           extraout_XMM0_Qa_01 *
           local_2a0.fElem[local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3 + 2] +
           gradx->fElem[lVar1 * 2 + lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar3 = lVar3 + 1;
    if (lVar3 == 10) {
      TPZFMatrix<double>::~TPZFMatrix(&local_2a0,&PTR_PTR_01814aa0);
      TPZFMatrix<double>::~TPZFMatrix(&local_118,&PTR_PTR_018b55a0);
      return;
    }
  } while( true );
}

Assistant:

void TPZQuadraticTetra::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
    
    gradx.Resize(3,3);
    gradx.Zero();
    int nrow = nodes.Rows();
    int ncol = nodes.Cols();
#ifdef PZDEBUG
    if(nrow != 3 || ncol  != 10){
        std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
        std::cout << "nodes matrix must be 3x10." << std::endl;
        DebugStop();
    }
    
#endif
    TPZFNMatrix<10,T> phi(NNodes,1);
    TPZFNMatrix<30,T> dphi(3,NNodes);
    TShape(loc,phi,dphi);
    for(int i = 0; i < NNodes; i++)
    {
        for(int j = 0; j < 3; j++)
        {
            gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
            gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
            gradx(j,2) += nodes.GetVal(j,i)*dphi(2,i);
        }
    }
    
}